

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void timediffFunc(sqlite3_context *context,int NotUsed1,sqlite3_value **argv)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  undefined8 uVar7;
  DateTime d2;
  DateTime local_88;
  StrAccum local_58;
  
  iVar2 = isDate(context,1,argv,&local_88);
  if (iVar2 == 0) {
    iVar2 = isDate(context,1,argv + 1,&d2);
    if (iVar2 == 0) {
      computeYMD_HMS(&local_88);
      computeYMD_HMS(&d2);
      if (local_88.iJD < d2.iJD) {
        iVar2 = d2.Y - local_88.Y;
        if (iVar2 != 0) {
          d2.Y = local_88.Y;
          d2.validJD = '\0';
          computeJD(&d2);
        }
        uVar4 = d2.M - local_88.M;
        uVar5 = uVar4 + 0xc;
        if (-1 < (int)uVar4) {
          uVar5 = uVar4;
        }
        uVar6 = (ulong)uVar5;
        if (uVar5 != 0) {
          d2.M = local_88.M;
          d2.validJD = '\0';
          computeJD(&d2);
        }
        uVar5 = iVar2 + ((int)uVar4 >> 0x1f);
        while (lVar3 = d2.iJD - local_88.iJD, d2.iJD < local_88.iJD) {
          iVar2 = (int)uVar6;
          uVar6 = (ulong)(iVar2 - 1);
          if (iVar2 < 1) {
            uVar6 = 0xb;
          }
          bVar1 = 0xb < d2.M;
          d2.M = d2.M + 1;
          if (bVar1) {
            d2.M = 1;
            d2.Y = d2.Y + 1;
          }
          uVar5 = uVar5 - (iVar2 < 1);
          d2.validJD = '\0';
          computeJD(&d2);
        }
        uVar7 = 0x2d;
      }
      else {
        iVar2 = local_88.Y - d2.Y;
        if (iVar2 != 0) {
          d2.Y = local_88.Y;
          d2.validJD = '\0';
          computeJD(&d2);
        }
        uVar4 = local_88.M - d2.M;
        uVar5 = (local_88.M + 0xc) - d2.M;
        if (-1 < (int)uVar4) {
          uVar5 = uVar4;
        }
        uVar6 = (ulong)uVar5;
        if (uVar5 != 0) {
          d2.M = local_88.M;
          d2.validJD = '\0';
          computeJD(&d2);
        }
        uVar5 = iVar2 + ((int)uVar4 >> 0x1f);
        while (lVar3 = local_88.iJD - d2.iJD, local_88.iJD < d2.iJD) {
          iVar2 = (int)uVar6;
          uVar6 = (ulong)(iVar2 - 1);
          if (iVar2 < 1) {
            uVar6 = 0xb;
          }
          bVar1 = d2.M < 2;
          d2.M = d2.M + -1;
          if (bVar1) {
            d2.M = 0xc;
            d2.Y = d2.Y + -1;
          }
          uVar5 = uVar5 - (iVar2 < 1);
          d2.validJD = '\0';
          computeJD(&d2);
        }
        uVar7 = 0x2b;
      }
      local_88.iJD = lVar3 + 0x873dcf4ec200;
      local_88.validYMD = '\0';
      local_88.validHMS = '\0';
      local_88.tz = 0;
      computeYMD_HMS(&local_88);
      local_58.db = (sqlite3 *)0x0;
      local_58.zText = (char *)0x0;
      local_58.nAlloc = 0;
      local_58.mxAlloc = 100;
      local_58.nChar = 0;
      local_58.accError = '\0';
      local_58.printfFlags = '\0';
      sqlite3_str_appendf(&local_58,"%c%04d-%02d-%02d %02d:%02d:%06.3f",local_88.s._0_4_,uVar7,
                          (ulong)uVar5,uVar6,(ulong)(local_88.D - 1),(ulong)(uint)local_88.h,
                          (ulong)(uint)local_88.m);
      sqlite3ResultStrAccum(context,&local_58);
    }
  }
  return;
}

Assistant:

static void timediffFunc(
  sqlite3_context *context,
  int NotUsed1,
  sqlite3_value **argv
){
  char sign;
  int Y, M;
  DateTime d1, d2;
  sqlite3_str sRes;
  UNUSED_PARAMETER(NotUsed1);
  if( isDate(context, 1, &argv[0], &d1) ) return;
  if( isDate(context, 1, &argv[1], &d2) ) return;
  computeYMD_HMS(&d1);
  computeYMD_HMS(&d2);
  if( d1.iJD>=d2.iJD ){
    sign = '+';
    Y = d1.Y - d2.Y;
    if( Y ){
      d2.Y = d1.Y;
      d2.validJD = 0;
      computeJD(&d2);
    }
    M = d1.M - d2.M;
    if( M<0 ){
      Y--;
      M += 12;
    }
    if( M!=0 ){
      d2.M = d1.M;
      d2.validJD = 0;
      computeJD(&d2);
    }
    while( d1.iJD<d2.iJD ){
      M--;
      if( M<0 ){
        M = 11;
        Y--;
      }
      d2.M--;
      if( d2.M<1 ){
        d2.M = 12;
        d2.Y--;
      }
      d2.validJD = 0;
      computeJD(&d2);
    }
    d1.iJD -= d2.iJD;
    d1.iJD += (u64)1486995408 * (u64)100000;
  }else /* d1<d2 */{
    sign = '-';
    Y = d2.Y - d1.Y;
    if( Y ){
      d2.Y = d1.Y;
      d2.validJD = 0;
      computeJD(&d2);
    }
    M = d2.M - d1.M;
    if( M<0 ){
      Y--;
      M += 12;
    }
    if( M!=0 ){
      d2.M = d1.M;
      d2.validJD = 0;
      computeJD(&d2);
    }
    while( d1.iJD>d2.iJD ){
      M--;
      if( M<0 ){
        M = 11;
        Y--;
      }
      d2.M++;
      if( d2.M>12 ){
        d2.M = 1;
        d2.Y++;
      }
      d2.validJD = 0;
      computeJD(&d2);
    }
    d1.iJD = d2.iJD - d1.iJD;
    d1.iJD += (u64)1486995408 * (u64)100000;
  }
  clearYMD_HMS_TZ(&d1);
  computeYMD_HMS(&d1);
  sqlite3StrAccumInit(&sRes, 0, 0, 0, 100);
  sqlite3_str_appendf(&sRes, "%c%04d-%02d-%02d %02d:%02d:%06.3f",
       sign, Y, M, d1.D-1, d1.h, d1.m, d1.s);
  sqlite3ResultStrAccum(context, &sRes);
}